

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryKeyTypeFloat_Test::TestBody
          (ValidationErrorTest_MapEntryKeyTypeFloat_Test *this)

{
  byte *pbVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  FileDescriptorProto file_proto;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_108 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_108);
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_108 + 0x30),0);
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar3->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,0);
  pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
  bVar2 = protobuf::internal::ValidateEnum(2,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
  if (bVar2) {
    (pVVar4->field_0)._impl_.type_ = 2;
    pbVar1 = (byte *)((long)&pVVar4->field_0 + 1);
    *pbVar1 = *pbVar1 | 4;
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120,
            "foo.proto: Foo.foo_map: TYPE: Key in map fields cannot be float/double, bytes or message types.\n"
           );
    ValidationErrorTest::BuildFileWithErrors
              (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_108,
               (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_120);
    testing::internal::
    MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~MatcherBase(&local_120);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x3a52,
                "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
               );
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryKeyTypeFloat) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* key =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          0);
  key->set_type(FieldDescriptorProto::TYPE_FLOAT);
  BuildFileWithErrors(file_proto, kMapEntryKeyTypeErrorMessage);
}